

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMReX_EB_STL_utils.cpp
# Opt level: O2

void __thiscall
amrex::STLtools::fill
          (STLtools *this,MultiFab *mf,IntVect *nghost,Geometry *geom,Real outside_value,
          Real inside_value)

{
  double dVar1;
  double dVar2;
  double dVar3;
  double dVar4;
  double dVar5;
  double dVar6;
  int iVar7;
  int iVar8;
  int iVar9;
  pointer pTVar10;
  long lVar11;
  long lVar12;
  double *pdVar13;
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  double dVar17;
  double dVar18;
  double dVar19;
  double dVar20;
  double dVar21;
  double dVar22;
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined8 uVar26;
  double dVar27;
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  bool bVar32;
  double dVar33;
  pointer pTVar34;
  double dVar35;
  XDim3 *pXVar36;
  Real RVar37;
  Real RVar38;
  Real RVar39;
  ulong uVar40;
  int *piVar41;
  Array4<double> *pAVar42;
  int iVar43;
  long lVar44;
  int iVar45;
  byte bVar46;
  long lVar47;
  byte bVar48;
  double *pdVar49;
  undefined4 in_R8D;
  int iVar50;
  undefined3 uVar51;
  uint in_R11D;
  uint uVar52;
  undefined4 uVar53;
  undefined4 uVar54;
  undefined4 uVar55;
  undefined4 uVar56;
  undefined4 uVar57;
  undefined4 uVar58;
  undefined4 uVar59;
  double dVar60;
  double dVar62;
  double dVar63;
  undefined1 auVar61 [16];
  double dVar64;
  undefined1 auVar65 [16];
  undefined1 auVar66 [16];
  double dVar67;
  double dVar68;
  double dVar69;
  double dVar70;
  undefined4 uVar71;
  undefined4 uVar72;
  double dVar73;
  double dVar74;
  double dVar75;
  double dVar76;
  double dVar77;
  undefined1 auVar78 [16];
  undefined1 auVar79 [16];
  double dVar80;
  double dVar81;
  ulong in_XMM9_Qb;
  double dVar82;
  double dVar83;
  double dVar84;
  double dVar85;
  double dVar86;
  double dVar87;
  double dVar88;
  double dVar89;
  ulong in_XMM14_Qb;
  double dVar90;
  MFIter mfi;
  double dStack_520;
  double dStack_500;
  double dStack_4d0;
  double dStack_4a0;
  double dStack_490;
  double dStack_470;
  Real local_468;
  Real local_458;
  Box local_444;
  Real local_428;
  undefined8 uStack_420;
  double local_418;
  undefined8 uStack_410;
  double local_408;
  undefined8 uStack_400;
  double local_3f8;
  undefined8 uStack_3f0;
  double local_3e8;
  undefined8 uStack_3e0;
  Array4<double> *local_3d0;
  IntVect *local_3c8;
  Real local_3c0;
  Real local_3b8;
  Real local_3b0;
  Real local_3a8;
  long local_3a0;
  ulong local_398;
  Real local_390;
  Real local_388;
  Real local_380;
  Real local_378;
  Real local_370;
  undefined1 local_368 [16];
  double local_358;
  Real RStack_350;
  double local_348;
  undefined8 uStack_340;
  double local_338;
  undefined8 uStack_330;
  double local_328;
  double dStack_320;
  undefined1 local_318 [16];
  double local_308;
  double dStack_300;
  undefined1 local_2f8 [16];
  undefined1 local_2e8 [16];
  double local_2d8;
  ulong uStack_2d0;
  undefined1 local_2c8 [16];
  double local_2b8;
  ulong uStack_2b0;
  undefined1 local_2a8 [16];
  double local_298;
  double dStack_290;
  double local_288;
  double dStack_280;
  double local_278;
  double dStack_270;
  undefined1 local_268 [16];
  double local_258;
  double dStack_250;
  double local_248;
  undefined8 uStack_240;
  undefined1 local_238 [16];
  undefined1 local_228 [16];
  undefined1 local_218 [16];
  undefined1 local_208 [16];
  undefined1 local_1f8 [16];
  undefined1 local_1e8 [16];
  double local_1d8;
  double dStack_1d0;
  double local_1c8;
  undefined1 local_1b8 [16];
  double local_1a8;
  double dStack_1a0;
  undefined1 local_198 [16];
  undefined1 local_188 [16];
  double local_178;
  undefined8 uStack_170;
  double local_168;
  undefined8 uStack_160;
  undefined1 local_158 [16];
  double local_148;
  double adStack_130 [6];
  Real local_100;
  Real RStack_f8;
  Real local_f0;
  Real local_e8;
  Real RStack_e0;
  Real local_d8;
  Real local_d0;
  Real RStack_c8;
  Real local_c0;
  Real local_a0;
  Real local_98;
  MFIter local_90;
  
  uVar52 = this->m_num_tri;
  dVar1 = (geom->prob_domain).xlo[0];
  local_3a8 = (geom->prob_domain).xlo[1];
  local_3b8 = (geom->prob_domain).xlo[2];
  dVar2 = (geom->super_CoordSys).dx[0];
  local_3b0 = (geom->super_CoordSys).dx[1];
  local_3c0 = (geom->super_CoordSys).dx[2];
  pTVar10 = (this->m_tri_pts_d).m_data;
  local_f0 = (this->m_ptmin).z;
  local_100 = (this->m_ptmin).x;
  RStack_f8 = (this->m_ptmin).y;
  local_d8 = (this->m_ptmax).z;
  local_e8 = (this->m_ptmax).x;
  RStack_e0 = (this->m_ptmax).y;
  local_d0 = (this->m_ptref).x;
  RStack_c8 = (this->m_ptref).y;
  local_c0 = (this->m_ptref).z;
  local_458 = outside_value;
  local_468 = inside_value;
  if (this->m_boundry_is_outside == false) {
    local_458 = inside_value;
    local_468 = outside_value;
  }
  local_3c8 = nghost;
  local_3d0 = (Array4<double> *)
              FabArray<amrex::FArrayBox>::arrays<amrex::FArrayBox,_0>
                        (&mf->super_FabArray<amrex::FArrayBox>);
  local_a0 = local_458;
  local_98 = local_468;
  local_444.smallend.vect[1] = Gpu::Device::max_gpu_streams;
  local_444.smallend.vect[2] = (int)FabArrayBase::mfiter_tile_size;
  local_444.bigend.vect[0] = FabArrayBase::mfiter_tile_size._4_4_;
  local_444.bigend.vect[1] = DAT_007d7ef0;
  local_444.smallend.vect[0] = CONCAT13(local_444.smallend.vect[0]._3_1_,0x10001);
  MFIter::MFIter(&local_90,(FabArrayBase *)mf,(MFItInfo *)&local_444);
  RVar39 = local_c0;
  RVar38 = local_d0;
  RVar37 = local_100;
  uVar40 = 0;
  if (0 < (int)uVar52) {
    uVar40 = (ulong)uVar52;
  }
  local_378 = RStack_f8;
  local_370 = local_e8;
  local_380 = RStack_e0;
  local_388 = local_f0;
  local_390 = local_d8;
  uStack_3e0 = DAT_006f1af0._8_8_;
  uVar71 = DAT_006f1af0._8_4_;
  uVar72 = DAT_006f1af0._12_4_;
  local_2f8._8_4_ = uVar71;
  local_2f8._0_8_ = (ulong)RStack_c8 ^ (ulong)DAT_006f1af0;
  local_2f8._12_4_ = uVar72;
  local_3e8 = (double)((ulong)DAT_006f1af0 ^ (ulong)local_c0);
  RStack_350 = RStack_c8;
  local_428 = RStack_c8;
  uStack_420 = 0;
  local_268._8_4_ = SUB84(RStack_c8,0);
  local_268._0_8_ = RStack_c8;
  local_268._12_4_ = (int)((ulong)RStack_c8 >> 0x20);
  local_278 = local_d0;
  dStack_270 = local_d0;
  local_288 = local_c0;
  dStack_280 = local_c0;
  local_358 = local_3e8;
  do {
    if (local_90.endIndex <= local_90.currentIndex) {
      MFIter::~MFIter(&local_90);
      Gpu::Device::streamSynchronize();
      return;
    }
    MFIter::growntilebox(&local_444,&local_90,local_3c8);
    piVar41 = &local_90.currentIndex;
    if (local_90.local_index_map != (Vector<int,_std::allocator<int>_> *)0x0) {
      piVar41 = ((local_90.local_index_map)->super_vector<int,_std::allocator<int>_>).
                super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
                _M_start + local_90.currentIndex;
    }
    local_398 = (ulong)(uint)local_444.bigend.vect[0];
    pAVar42 = local_3d0 + *piVar41;
    for (iVar43 = local_444.smallend.vect[2]; iVar43 <= local_444.bigend.vect[2];
        iVar43 = iVar43 + 1) {
      dVar80 = (double)iVar43 * local_3c0 + local_3b8;
      local_148 = dVar80;
      if (dVar80 <= RVar39) {
        local_148 = RVar39;
      }
      local_1c8 = dVar80;
      if (RVar39 <= dVar80) {
        local_1c8 = RVar39;
      }
      dVar17 = RVar39 - dVar80;
      local_2e8._0_8_ = -dVar80;
      uStack_2d0 = in_XMM9_Qb ^ 0x8000000000000000;
      local_2a8._8_4_ = SUB84(dVar80,0);
      local_2a8._0_8_ = dVar80;
      local_2a8._12_4_ = (int)((ulong)dVar80 >> 0x20);
      local_2e8._8_4_ = SUB84(dVar80,0);
      local_2e8._12_4_ = (int)((ulong)local_2e8._0_8_ >> 0x20);
      local_368._8_8_ = dVar80;
      local_368._0_8_ = local_2e8._0_8_;
      local_228._8_8_ = 0;
      local_228._0_8_ = dVar17;
      local_238._8_4_ = SUB84(dVar17,0);
      local_238._0_8_ = dVar17;
      local_238._12_4_ = (int)((ulong)dVar17 >> 0x20);
      local_3a0 = (long)iVar43;
      for (iVar45 = local_444.smallend.vect[1]; iVar45 <= local_444.bigend.vect[1];
          iVar45 = iVar45 + 1) {
        if (local_444.smallend.vect[0] <= local_444.bigend.vect[0]) {
          iVar7 = (pAVar42->begin).y;
          lVar11 = pAVar42->jstride;
          iVar8 = (pAVar42->begin).z;
          lVar12 = pAVar42->kstride;
          pdVar13 = pAVar42->p;
          iVar9 = (pAVar42->begin).x;
          local_298 = (double)iVar45 * local_3b0 + local_3a8;
          dVar33 = local_298;
          if (local_298 <= local_428) {
            dVar33 = local_428;
          }
          dVar35 = local_298;
          if (local_428 <= local_298) {
            dVar35 = local_428;
          }
          dVar21 = local_428 * dVar80 + local_298 * local_3e8;
          dVar18 = local_298 - local_428;
          local_2c8._0_8_ = -local_298;
          uStack_2b0 = in_XMM14_Qb ^ 0x8000000000000000;
          local_2c8._8_4_ = SUB84(local_298,0);
          local_2c8._12_4_ = (int)((ulong)local_2c8._0_8_ >> 0x20);
          local_1f8._8_4_ = (int)in_XMM14_Qb;
          local_1f8._0_8_ = dVar18;
          local_1f8._12_4_ = (int)(in_XMM14_Qb >> 0x20);
          local_208._8_4_ = SUB84(dVar18,0);
          local_208._0_8_ = dVar18;
          local_208._12_4_ = (int)((ulong)dVar18 >> 0x20);
          local_1e8._8_4_ = (int)uStack_420;
          local_1e8._0_8_ = dVar21;
          local_1e8._12_4_ = (int)((ulong)uStack_420 >> 0x20);
          local_218._8_4_ = SUB84(dVar21,0);
          local_218._0_8_ = dVar21;
          local_218._12_4_ = (int)((ulong)dVar21 >> 0x20);
          lVar44 = (long)local_444.smallend.vect[0];
          do {
            dVar27 = (double)(int)lVar44 * dVar2 + dVar1;
            lVar47 = 0x90;
            if (((((RVar37 <= dVar27) && (dVar27 <= local_370)) && (local_378 <= local_298)) &&
                ((local_298 <= local_380 && (local_388 <= dVar80)))) && (dVar80 <= local_390)) {
              uVar26 = CONCAT44(uVar72,uVar71);
              dVar73 = dVar27;
              if (dVar27 <= RVar38) {
                dVar73 = RVar38;
              }
              dVar83 = dVar27;
              if (RVar38 <= dVar27) {
                dVar83 = RVar38;
              }
              dVar22 = RVar38 * local_298 + dVar27 * (double)local_2f8._0_8_;
              local_1a8 = RVar38 * dVar80 + dVar27 * local_3e8;
              local_188._0_8_ = RVar38 - dVar27;
              local_1b8._8_4_ = SUB84(dVar27,0);
              local_1b8._0_8_ = dVar27;
              local_1b8._12_4_ = (int)((ulong)dVar27 >> 0x20);
              uStack_170 = 0;
              local_188._8_8_ = local_188._0_8_;
              local_158._8_8_ = 0;
              local_158._0_8_ = dVar22;
              local_198._8_4_ = SUB84(dVar22,0);
              local_198._0_8_ = dVar22;
              local_198._12_4_ = (int)((ulong)dVar22 >> 0x20);
              uStack_160 = 0;
              uVar52 = 0;
              for (lVar47 = 0; uVar40 * 0x48 - lVar47 != 0; lVar47 = lVar47 + 0x48) {
                dVar3 = *(double *)((long)&(pTVar10->v1).x + lVar47);
                uVar57 = (undefined4)((ulong)dVar3 >> 0x20);
                dVar4 = *(double *)((long)&(pTVar10->v2).x + lVar47);
                dVar85 = *(double *)((long)&(pTVar10->v3).x + lVar47);
                uVar56 = (undefined4)((ulong)dVar4 >> 0x20);
                uVar55 = SUB84(dVar4,0);
                uVar53 = uVar56;
                if (dVar3 <= dVar4) {
                  uVar55 = SUB84(dVar3,0);
                  uVar53 = uVar57;
                }
                dVar89 = dVar85;
                if ((double)CONCAT44(uVar53,uVar55) <= dVar85) {
                  dVar89 = (double)CONCAT44(uVar53,uVar55);
                }
                if (dVar89 <= dVar73) {
                  uVar55 = SUB84(dVar4,0);
                  pTVar34 = (pointer)&pTVar10->v2;
                  if (dVar4 <= dVar3) {
                    uVar55 = SUB84(dVar3,0);
                    uVar56 = uVar57;
                    pTVar34 = pTVar10;
                  }
                  if ((double)CONCAT44(uVar56,uVar55) <= dVar85 &&
                      dVar85 != (double)CONCAT44(uVar56,uVar55)) {
                    pTVar34 = (pointer)&pTVar10->v3;
                  }
                  pdVar49 = (double *)((long)&(pTVar34->v1).x + lVar47);
                  if (dVar83 < *pdVar49 || dVar83 == *pdVar49) {
                    dVar89 = *(double *)((long)&(pTVar10->v1).y + lVar47);
                    dVar77 = *(double *)((long)&(pTVar10->v2).y + lVar47);
                    dVar90 = *(double *)((long)&(pTVar10->v3).y + lVar47);
                    uVar53 = SUB84(dVar77,0);
                    uVar57 = (undefined4)((ulong)dVar77 >> 0x20);
                    uVar54 = (undefined4)((ulong)dVar89 >> 0x20);
                    uVar55 = uVar53;
                    uVar56 = uVar57;
                    if (dVar89 <= dVar77) {
                      uVar55 = SUB84(dVar89,0);
                      uVar56 = uVar54;
                    }
                    dVar5 = dVar90;
                    if ((double)CONCAT44(uVar56,uVar55) <= dVar90) {
                      dVar5 = (double)CONCAT44(uVar56,uVar55);
                    }
                    if (dVar5 <= dVar33) {
                      uVar55 = uVar53;
                      uVar56 = uVar57;
                      pXVar36 = &pTVar10->v2;
                      if (dVar77 <= dVar89) {
                        uVar55 = SUB84(dVar89,0);
                        uVar56 = uVar54;
                        pXVar36 = &pTVar10->v1;
                      }
                      if ((double)CONCAT44(uVar56,uVar55) <= dVar90 &&
                          dVar90 != (double)CONCAT44(uVar56,uVar55)) {
                        pXVar36 = &pTVar10->v3;
                      }
                      pdVar49 = (double *)((long)&pXVar36->y + lVar47);
                      if (dVar35 < *pdVar49 || dVar35 == *pdVar49) {
                        dVar5 = *(double *)((long)&(pTVar10->v1).z + lVar47);
                        dVar81 = *(double *)((long)&(pTVar10->v2).z + lVar47);
                        dVar6 = *(double *)((long)&(pTVar10->v3).z + lVar47);
                        uVar54 = SUB84(dVar81,0);
                        uVar58 = (undefined4)((ulong)dVar81 >> 0x20);
                        uVar59 = (undefined4)((ulong)dVar5 >> 0x20);
                        uVar55 = uVar54;
                        uVar56 = uVar58;
                        if (dVar5 <= dVar81) {
                          uVar55 = SUB84(dVar5,0);
                          uVar56 = uVar59;
                        }
                        dVar19 = dVar6;
                        if ((double)CONCAT44(uVar56,uVar55) <= dVar6) {
                          dVar19 = (double)CONCAT44(uVar56,uVar55);
                        }
                        if (dVar19 <= local_148) {
                          uVar55 = uVar54;
                          uVar56 = uVar58;
                          pXVar36 = &pTVar10->v2;
                          if (dVar81 <= dVar5) {
                            uVar55 = SUB84(dVar5,0);
                            uVar56 = uVar59;
                            pXVar36 = &pTVar10->v1;
                          }
                          if ((double)CONCAT44(uVar56,uVar55) <= dVar6 &&
                              dVar6 != (double)CONCAT44(uVar56,uVar55)) {
                            pXVar36 = &pTVar10->v3;
                          }
                          pdVar49 = (double *)((long)&pXVar36->z + lVar47);
                          if (local_1c8 < *pdVar49 || local_1c8 == *pdVar49) {
                            local_318._8_4_ = uVar71;
                            local_318._0_8_ = dVar27;
                            local_318._12_4_ = uVar72;
                            auVar66._8_4_ = uVar53;
                            auVar66._0_8_ = dVar89;
                            auVar66._12_4_ = uVar57;
                            dVar62 = dVar4 - dVar85;
                            uStack_410 = 0;
                            dVar63 = dVar81 - dVar6;
                            local_308 = dVar77 - dVar89;
                            dStack_300 = dVar89 - dVar90;
                            dVar82 = dVar90 - dVar77;
                            dVar64 = dVar85 * dVar89 - dVar3 * dVar90;
                            local_408 = dVar85 * dVar5 - dVar3 * dVar6;
                            uStack_400 = 0;
                            local_248 = dVar90 * dVar5 - dVar89 * dVar6;
                            dVar75 = dVar4 * dVar90 - dVar85 * dVar77;
                            dVar68 = dVar4 * dVar6 - dVar85 * dVar81;
                            auVar79._8_4_ = uVar54;
                            auVar79._0_8_ = dVar5;
                            auVar79._12_4_ = uVar58;
                            dStack_4d0 = auVar66._8_8_;
                            dVar86 = dVar6 * dStack_4d0 - dVar90 * dVar81;
                            dVar19 = dVar18 * (dVar3 * dVar81 - dVar4 * dVar5) +
                                     dVar17 * (dVar3 * dVar77 - dVar4 * dVar89) +
                                     dVar21 * (dVar3 - dVar4) +
                                     local_188._0_8_ * (dVar81 * dVar89 - dVar77 * dVar5) +
                                     dVar22 * (dVar5 - dVar81) + local_1a8 * local_308;
                            dVar20 = (double)local_208._8_8_ * dVar68 +
                                     (double)local_238._8_8_ * dVar75 +
                                     (double)local_218._8_8_ * dVar62 +
                                     local_188._0_8_ * dVar86 +
                                     (double)local_198._8_8_ * dVar63 + local_1a8 * dVar82;
                            local_338 = dVar6 - dVar5;
                            uStack_330 = 0;
                            uStack_240 = 0;
                            local_348 = dVar85 - dVar3;
                            uStack_340 = 0;
                            dVar60 = dVar18 * local_408 +
                                     dVar17 * dVar64 +
                                     dVar21 * local_348 +
                                     local_188._0_8_ * local_248 +
                                     dVar22 * local_338 + local_1a8 * dStack_300;
                            auVar29._8_8_ = -(ulong)(ABS(dVar20) < 2.220446049250313e-16);
                            auVar29._0_8_ = -(ulong)(ABS(dVar19) < 2.220446049250313e-16);
                            in_R11D = movmskpd(in_R11D,auVar29);
                            bVar46 = (byte)in_R11D;
                            dVar67 = ABS(dVar60);
                            bVar48 = dVar67 < 2.220446049250313e-16 & bVar46 >> 1;
                            dStack_4a0 = auVar79._8_8_;
                            local_418 = dVar81;
                            local_3f8 = dVar73;
                            uStack_3f0 = uVar26;
                            local_328 = dVar89;
                            dStack_320 = dVar90;
                            local_258 = dStack_300;
                            dStack_250 = dStack_300;
                            local_1d8 = dVar3;
                            dStack_1d0 = dVar4;
                            if (((in_R11D & 1) == 0) || (bVar48 == 0)) {
                              dVar85 = -dVar5;
                              auVar24._8_4_ = SUB84(dVar75,0);
                              auVar24._0_8_ = dVar75;
                              auVar24._12_4_ = (int)((ulong)dVar75 >> 0x20);
                              auVar25._8_4_ = SUB84(dVar63,0);
                              auVar25._0_8_ = dVar63;
                              auVar25._12_4_ = (int)((ulong)dVar63 >> 0x20);
                              dStack_500 = auVar24._8_8_;
                              dStack_520 = auVar25._8_8_;
                              if ((0.0 <= dVar60) || ((0.0 <= dVar19 || (0.0 <= dVar20)))) {
                                auVar28._8_8_ = -(ulong)(0.0 < dVar20);
                                auVar28._0_8_ = -(ulong)(0.0 < dVar19);
                                iVar50 = movmskpd(in_R8D,auVar28);
                                uVar51 = (undefined3)((uint)iVar50 >> 8);
                                in_R8D = CONCAT31(uVar51,iVar50 == 3);
                                if (((0.0 < dVar60) && (iVar50 == 3)) ||
                                   (((bVar32 = 0.0 < dVar20 * dVar60,
                                     in_R8D = CONCAT31(uVar51,bVar32), (bVar46 & bVar32) != 0 ||
                                     (bVar32 = 0.0 < dVar60 * dVar19,
                                     in_R8D = CONCAT31(uVar51,bVar32), (bVar46 >> 1 & bVar32) != 0))
                                    || ((dVar67 < 2.220446049250313e-16 && (0.0 < dVar20 * dVar19)))
                                    ))) goto LAB_006da434;
                                if ((in_R11D & 1) == 0) {
                                  if (bVar48 == 0) goto LAB_006da562;
LAB_006da6fd:
                                  dVar3 = (dVar82 * (dVar27 * dVar5 + dVar3 * local_2e8._0_8_) +
                                          dStack_520 * (dVar27 * dVar89 + local_2c8._0_8_ * dVar3) +
                                          dVar86 * (dVar27 - dVar3) +
                                          dVar62 * (local_298 * dVar5 + local_2e8._0_8_ * dVar89) +
                                          dStack_500 * (dVar80 - dVar5) +
                                          (dVar89 - local_298) * dVar68) *
                                          (dVar82 * (dVar3 * RVar39 + RVar38 * dVar85) +
                                          dVar63 * (dVar3 * local_428 + -dVar89 * RVar38) +
                                          dVar86 * (dVar3 - RVar38) +
                                          dVar62 * (dVar89 * RVar39 + dVar85 * local_428) +
                                          dVar75 * (dVar5 - RVar39) + (local_428 - dVar89) * dVar68)
                                  ;
                                }
                                else {
                                  if (bVar46 >> 1 != 0) goto LAB_006da6fd;
                                  if (2.220446049250313e-16 <= dVar67) goto LAB_006da562;
                                  dVar3 = (dStack_300 *
                                           (dVar27 * dVar81 + dVar4 * (double)local_2e8._8_8_) +
                                          local_338 *
                                          (dVar27 * dVar77 + (double)local_2c8._8_8_ * dVar4) +
                                          local_248 * (dVar27 - dVar4) +
                                          local_348 *
                                          (local_298 * dVar81 + (double)local_2e8._8_8_ * dVar77) +
                                          dVar64 * (dVar80 - dVar81) +
                                          local_408 * (dVar77 - local_298)) *
                                          (dStack_300 * (dVar4 * RVar39 + RVar38 * -dStack_4a0) +
                                          local_338 * (dVar4 * local_428 + -dStack_4d0 * RVar38) +
                                          local_248 * (dVar4 - RVar38) +
                                          local_348 * (dVar77 * RVar39 + -dStack_4a0 * local_428) +
                                          dVar64 * (dVar81 - RVar39) +
                                          local_408 * (local_428 - dVar77));
                                }
                              }
                              else {
LAB_006da434:
                                dVar3 = (dVar82 * (RVar38 * dVar5 + dVar3 * local_3e8) +
                                        dStack_520 *
                                        (RVar38 * dVar89 + (double)local_2f8._0_8_ * dVar3) +
                                        dVar86 * (RVar38 - dVar3) +
                                        dVar62 * (RStack_350 * dVar5 + local_3e8 * dVar89) +
                                        dStack_500 * (RVar39 - dVar5) +
                                        (dVar89 - RStack_350) * dVar68) *
                                        (dVar82 * (dVar3 * dVar80 + dVar27 * dVar85) +
                                        dVar63 * (dVar3 * local_298 + -dVar89 * dVar27) +
                                        dVar86 * (dVar3 - dVar27) +
                                        dVar62 * (dVar89 * dVar80 + dVar85 * local_298) +
                                        dVar75 * (dVar5 - dVar80) + (local_298 - dVar89) * dVar68);
                              }
                              if (dVar3 <= 0.0) goto LAB_006da562;
                            }
                            else {
                              dVar74 = dVar4 - dVar3;
                              dVar76 = dVar3 - dVar85;
                              dVar75 = dVar81 - dVar5;
                              dVar69 = dVar5 - dVar6;
                              dVar63 = -local_308;
                              dVar88 = dVar85 - dVar4;
                              dVar64 = dVar6 - dVar81;
                              local_408 = -dVar82;
                              auVar23._8_4_ = SUB84(dStack_300,0);
                              auVar23._0_8_ = dVar63;
                              auVar23._12_4_ = (uint)((ulong)dStack_300 >> 0x20) ^ 0x80000000;
                              uStack_400 = 0x8000000000000000;
                              dVar84 = dVar74 * ((double)local_268._0_8_ - dVar89) +
                                       dVar63 * (local_278 - dVar3);
                              dVar87 = dVar88 * ((double)local_268._8_8_ - dStack_4d0) +
                                       local_408 * (dStack_270 - dVar4);
                              dVar19 = -dVar75;
                              auVar14._8_4_ = SUB84(dVar69,0);
                              auVar14._0_8_ = dVar19;
                              auVar14._12_4_ = (uint)((ulong)dVar69 >> 0x20) ^ 0x80000000;
                              dVar67 = local_308 * (local_288 - dVar5) +
                                       dVar19 * ((double)local_268._0_8_ - dVar89);
                              dVar68 = dVar82 * (dStack_280 - dStack_4a0) +
                                       -dVar64 * ((double)local_268._8_8_ - dStack_4d0);
                              dVar20 = -dVar74;
                              auVar15._8_4_ = SUB84(dVar76,0);
                              auVar15._0_8_ = dVar20;
                              auVar15._12_4_ = (uint)((ulong)dVar76 >> 0x20) ^ 0x80000000;
                              dVar60 = dVar75 * (local_278 - dVar3) + dVar20 * (local_288 - dVar5);
                              dVar62 = dVar64 * (dStack_270 - dVar4) +
                                       -dVar88 * (dStack_280 - dStack_4a0);
                              auVar65._0_8_ = dVar67 * dVar67 + dVar60 * dVar60;
                              auVar65._8_8_ = dVar68 * dVar68 + dVar62 * dVar62;
                              dVar67 = local_308 * local_338 - (dVar90 - dVar89) * dVar75;
                              dVar68 = dStack_300 * (RVar39 - dVar6) -
                                       (RStack_350 - dVar90) * dVar69;
                              dVar86 = dVar75 * local_348 - local_338 * dVar74;
                              dVar70 = dVar69 * (RVar38 - dVar85) - (RVar39 - dVar6) * dVar76;
                              auVar78._0_8_ = local_348 * local_308;
                              auVar78._8_8_ = (RVar38 - dVar85) * dStack_300;
                              dVar60 = dVar74 * (dVar90 - dVar89) - auVar78._0_8_;
                              dVar62 = dVar76 * (RStack_350 - dVar90) - auVar78._8_8_;
                              auVar30._8_8_ = dVar87 * dVar87 + auVar65._8_8_;
                              auVar30._0_8_ = dVar84 * dVar84 + auVar65._0_8_;
                              auVar79 = sqrtpd(auVar78,auVar30);
                              dVar62 = dVar62 * dVar62 + dVar68 * dVar68 + dVar70 * dVar70;
                              auVar16._8_4_ = SUB84(dVar62,0);
                              auVar16._0_8_ = dVar60 * dVar60 + dVar67 * dVar67 + dVar86 * dVar86;
                              auVar16._12_4_ = (int)((ulong)dVar62 >> 0x20);
                              auVar66 = sqrtpd(auVar65,auVar16);
                              dVar60 = auVar66._0_8_ * 0.5;
                              if (ABS((auVar66._8_8_ * 0.5 +
                                      auVar79._8_8_ * 0.5 + auVar79._0_8_ * 0.5) - dVar60) <=
                                  2.220446049250313e-16) {
                                auVar61._0_8_ = dVar27 - dVar4;
                                auVar61._8_8_ = local_318._8_8_;
                                dVar62 = dVar88 * (local_298 - dVar77) + local_408 * auVar61._0_8_;
                                dVar77 = dVar82 * (dVar80 - dVar81) + (local_298 - dVar77) * -dVar64
                                ;
                                dVar81 = dVar64 * auVar61._0_8_ + (dVar80 - dVar81) * -dVar88;
                                dStack_470 = auVar23._8_8_;
                                dVar63 = dVar74 * (local_298 - dVar89) + dVar63 * (dVar27 - dVar3);
                                dVar64 = dVar76 * (local_298 - dVar90) +
                                         dStack_470 * ((double)local_1b8._8_8_ - dVar85);
                                dStack_500 = auVar14._8_8_;
                                dVar89 = local_308 * (dVar80 - dVar5) +
                                         (local_298 - dVar89) * dVar19;
                                dVar90 = dStack_300 * ((double)local_2a8._8_8_ - dVar6) +
                                         (local_298 - dVar90) * dStack_500;
                                dStack_490 = auVar15._8_8_;
                                dVar3 = dVar75 * (dVar27 - dVar3) + (dVar80 - dVar5) * dVar20;
                                dVar4 = dVar69 * ((double)local_1b8._8_8_ - dVar85) +
                                        ((double)local_2a8._8_8_ - dVar6) * dStack_490;
                                auVar31._8_8_ = dVar64 * dVar64 + dVar90 * dVar90 + dVar4 * dVar4;
                                auVar31._0_8_ = dVar63 * dVar63 + dVar89 * dVar89 + dVar3 * dVar3;
                                auVar66 = sqrtpd(auVar61,auVar31);
                                if (ABS((auVar66._8_8_ * 0.5 +
                                        SQRT(dVar62 * dVar62 + dVar77 * dVar77 + dVar81 * dVar81) *
                                        0.5 + auVar66._0_8_ * 0.5) - dVar60) <=
                                    2.220446049250313e-16) goto LAB_006da562;
                              }
                            }
                            uVar52 = uVar52 + 1;
                          }
                        }
                      }
                    }
                  }
                }
LAB_006da562:
              }
              lVar47 = (ulong)(uVar52 & 1) * 8 + 0x90;
              dStack_1a0 = local_1a8;
              local_178 = local_188._0_8_;
              local_168 = local_1a8;
            }
            pdVar13[((long)iVar45 - (long)iVar7) * lVar11 +
                    (local_3a0 - iVar8) * lVar12 + (lVar44 - iVar9)] =
                 *(double *)((long)adStack_130 + lVar47);
            lVar44 = lVar44 + 1;
            local_2b8 = local_2c8._0_8_;
            dStack_290 = local_298;
          } while (local_444.bigend.vect[0] + 1U != (int)lVar44);
        }
      }
      local_2d8 = local_2e8._0_8_;
    }
    MFIter::operator++(&local_90);
  } while( true );
}

Assistant:

void
STLtools::fill (MultiFab& mf, IntVect const& nghost, Geometry const& geom,
                Real outside_value, Real inside_value) const
{
    int num_triangles = m_num_tri;

    const auto plo = geom.ProbLoArray();
    const auto dx  = geom.CellSizeArray();

    const Triangle* tri_pts = m_tri_pts_d.data();
    XDim3 ptmin = m_ptmin;
    XDim3 ptmax = m_ptmax;
    XDim3 ptref = m_ptref;
    Real reference_value = m_boundry_is_outside ? outside_value :  inside_value;
    Real other_value     = m_boundry_is_outside ?  inside_value : outside_value;

    auto const& ma = mf.arrays();

    ParallelFor(mf, nghost, [=] AMREX_GPU_DEVICE (int box_no, int i, int j, int k) noexcept
    {
        Real coords[3];
        coords[0]=plo[0]+i*dx[0];
        coords[1]=plo[1]+j*dx[1];
#if (AMREX_SPACEDIM == 2)
        coords[2]=Real(0.);
#else
        coords[2]=plo[2]+k*dx[2];
#endif
        int num_intersects=0;
        if (coords[0] >= ptmin.x && coords[0] <= ptmax.x &&
            coords[1] >= ptmin.y && coords[1] <= ptmax.y &&
            coords[2] >= ptmin.z && coords[2] <= ptmax.z)
        {
            Real pr[]={ptref.x, ptref.y, ptref.z};
            for (int tr=0; tr < num_triangles; ++tr) {
                if (line_tri_intersects(pr, coords, tri_pts[tr])) {
                    ++num_intersects;
                }
            }
        }
        ma[box_no](i,j,k) = (num_intersects % 2 == 0) ? reference_value : other_value;
    });
    Gpu::streamSynchronize();
}